

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O0

void xc_mgga_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,double *zk,double *vrho,double *vsigma,double *vlapl,
                        double *vtau,double *v2rho2,double *v2rhosigma,double *v2rholapl,
                        double *v2rhotau,double *v2sigma2,double *v2sigmalapl,double *v2sigmatau,
                        double *v2lapl2,double *v2lapltau,double *v2tau2)

{
  xc_mgga_out_params out;
  undefined1 local_260 [608];
  
  memset(local_260,0,0x230);
  xc_mgga_new((xc_func_type *)out.v4sigma4,out.v4rhotau3._4_4_,(size_t)out.v4rholapltau2,
              out.v4rholapl2tau,out.v4rholapl3,out.v4rhosigmatau2,out.v4sigmalapltau2,
              (xc_mgga_out_params *)out.v4sigmatau3);
  return;
}

Assistant:

void xc_mgga_exc_vxc_fxc(const xc_func_type *p, size_t np,
                         const double *rho, const double *sigma, const double *lapl, const double *tau,
                         double *zk, double *vrho, double *vsigma, double *vlapl, double *vtau,
                         double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                         double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                         double *v2lapltau, double *v2tau2)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;

  xc_mgga_new(p, 2, np, rho, sigma, lapl, tau, &out);
}